

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O0

void test_read_format_zip_xz_multi(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_32073;
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ͧ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_lzma((archive *)ae);
  if (iVar1 == 0) {
    extract_reference_file((char *)a);
    wVar2 = archive_read_support_format_zip((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ͯ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",ae);
    wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x25);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'Ͱ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 37)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'Ͳ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_format_name((archive *)ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ͳ',"ZIP 2.0 (xz)","\"ZIP 2.0 (xz)\"",pcVar3,"archive_format_name(a)",(void *)0x0,
               L'\0');
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ʹ',"bash.bashrc","\"bash.bashrc\"",pcVar3,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    iVar1 = extract_one((archive *)ae,local_20,0xf751b8c9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'͵',0,"0",(long)iVar1,"extract_one(a, ae, 0xF751B8C9)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ͷ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_format_name((archive *)ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'͸',"ZIP 2.0 (xz)","\"ZIP 2.0 (xz)\"",pcVar3,"archive_format_name(a)",(void *)0x0,
               L'\0');
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'͹',"pacman.conf","\"pacman.conf\"",pcVar3,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    iVar1 = extract_one((archive *)ae,local_20,0xb20b7f88);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ͺ',0,"0",(long)iVar1,"extract_one(a, ae, 0xB20B7F88)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ͼ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    pcVar3 = archive_format_name((archive *)ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L'ͽ',"ZIP 2.0 (xz)","\"ZIP 2.0 (xz)\"",pcVar3,"archive_format_name(a)",(void *)0x0,
               L'\0');
    pcVar3 = archive_entry_pathname(local_20);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
               ,L';',"profile","\"profile\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
    ;
    iVar1 = extract_one((archive *)ae,local_20,0x2329f054);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'Ϳ',0,"0",(long)iVar1,"extract_one(a, ae, 0x2329F054)",ae);
    iVar1 = archive_read_next_header((archive *)ae,&local_20);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'΁',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    iVar1 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'΂',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
    iVar1 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'΃',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",ae);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ͩ');
    test_skipping("lzma reading not fully supported on this platform");
    iVar1 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'ͪ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_xz_multi)
{
	const char *refname = "test_read_format_zip_xz_multi.zipx";
	struct archive *a;
	struct archive_entry *ae;

	assert((a = archive_read_new()) != NULL);
	if (ARCHIVE_OK != archive_read_support_filter_lzma(a)) {
			skipping("lzma reading not fully supported on this platform");
			assertEqualInt(ARCHIVE_OK, archive_read_free(a));
			return;
	}
	extract_reference_file(refname);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 37));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 2.0 (xz)", archive_format_name(a));
	assertEqualString("bash.bashrc", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0xF751B8C9));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 2.0 (xz)", archive_format_name(a));
	assertEqualString("pacman.conf", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0xB20B7F88));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 2.0 (xz)", archive_format_name(a));
	assertEqualString("profile", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0x2329F054));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}